

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

ssize_t __thiscall
Json::FastWriter::write_abi_cxx11_(FastWriter *this,int __fd,void *__buf,size_t __n)

{
  string *psVar1;
  undefined4 in_register_00000034;
  FastWriter *this_00;
  
  this_00 = (FastWriter *)CONCAT44(in_register_00000034,__fd);
  psVar1 = &this_00->document_;
  std::__cxx11::string::assign((char *)psVar1);
  writeValue(this_00,(Value *)__buf);
  if (this_00->omitEndingLineFeed_ == false) {
    std::__cxx11::string::append((char *)psVar1);
  }
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  return (ssize_t)this;
}

Assistant:

std::string FastWriter::write(const Value& root) {
  document_ = "";
  writeValue(root);
  if (!omitEndingLineFeed_)
    document_ += "\n";
  return document_;
}